

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O3

void __thiscall
pbrt::GoniometricLight::GoniometricLight
          (GoniometricLight *this,Transform *renderFromLight,MediumInterface *mediumInterface,
          SpectrumHandle *I,Float scale,Image *im,RGBColorSpace *imageColorSpace,Allocator alloc)

{
  PiecewiseConstant1D *pPVar1;
  memory_resource *pmVar2;
  size_t sVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  int iVar19;
  Point2<float> PVar20;
  Allocator AVar21;
  long in_FS_OFFSET;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  span<const_float> func;
  Bounds2f domain_00;
  Array2D<float> d;
  Bounds2f domain;
  _Any_data local_e8;
  code *local_d8;
  code *local_d0;
  int va;
  float fStack_c4;
  Tuple2<pbrt::Point2,_float> TStack_c0;
  vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>
  local_b8;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_98;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_78;
  Float local_58;
  Float FStack_54;
  Float local_50;
  Tuple2<pbrt::Point2,_float> local_48;
  undefined8 uStack_40;
  
  (this->super_LightBase).type = DeltaPosition;
  (this->super_LightBase).mediumInterface.inside.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = 0;
  (this->super_LightBase).mediumInterface.inside.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (mediumInterface->inside).
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
          .bits;
  (this->super_LightBase).mediumInterface.outside.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = 0;
  (this->super_LightBase).mediumInterface.outside.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (mediumInterface->outside).
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
          .bits;
  uVar4 = *(undefined8 *)((renderFromLight->m).m[0] + 2);
  uVar5 = *(undefined8 *)(renderFromLight->m).m[1];
  uVar6 = *(undefined8 *)((renderFromLight->m).m[1] + 2);
  uVar7 = *(undefined8 *)(renderFromLight->m).m[2];
  uVar8 = *(undefined8 *)((renderFromLight->m).m[2] + 2);
  uVar9 = *(undefined8 *)(renderFromLight->m).m[3];
  uVar10 = *(undefined8 *)((renderFromLight->m).m[3] + 2);
  uVar11 = *(undefined8 *)(renderFromLight->mInv).m[0];
  uVar12 = *(undefined8 *)((renderFromLight->mInv).m[0] + 2);
  uVar13 = *(undefined8 *)(renderFromLight->mInv).m[1];
  uVar14 = *(undefined8 *)((renderFromLight->mInv).m[1] + 2);
  uVar15 = *(undefined8 *)(renderFromLight->mInv).m[2];
  uVar16 = *(undefined8 *)((renderFromLight->mInv).m[2] + 2);
  uVar17 = *(undefined8 *)(renderFromLight->mInv).m[3];
  uVar18 = *(undefined8 *)((renderFromLight->mInv).m[3] + 2);
  *(undefined8 *)(this->super_LightBase).renderFromLight.m.m[0] =
       *(undefined8 *)(renderFromLight->m).m[0];
  *(undefined8 *)((this->super_LightBase).renderFromLight.m.m[0] + 2) = uVar4;
  *(undefined8 *)(this->super_LightBase).renderFromLight.m.m[1] = uVar5;
  *(undefined8 *)((this->super_LightBase).renderFromLight.m.m[1] + 2) = uVar6;
  *(undefined8 *)(this->super_LightBase).renderFromLight.m.m[2] = uVar7;
  *(undefined8 *)((this->super_LightBase).renderFromLight.m.m[2] + 2) = uVar8;
  *(undefined8 *)(this->super_LightBase).renderFromLight.m.m[3] = uVar9;
  *(undefined8 *)((this->super_LightBase).renderFromLight.m.m[3] + 2) = uVar10;
  *(undefined8 *)(this->super_LightBase).renderFromLight.mInv.m[0] = uVar11;
  *(undefined8 *)((this->super_LightBase).renderFromLight.mInv.m[0] + 2) = uVar12;
  *(undefined8 *)(this->super_LightBase).renderFromLight.mInv.m[1] = uVar13;
  *(undefined8 *)((this->super_LightBase).renderFromLight.mInv.m[1] + 2) = uVar14;
  *(undefined8 *)(this->super_LightBase).renderFromLight.mInv.m[2] = uVar15;
  *(undefined8 *)((this->super_LightBase).renderFromLight.mInv.m[2] + 2) = uVar16;
  *(undefined8 *)(this->super_LightBase).renderFromLight.mInv.m[3] = uVar17;
  *(undefined8 *)((this->super_LightBase).renderFromLight.mInv.m[3] + 2) = uVar18;
  *(long *)(in_FS_OFFSET + -0x228) = *(long *)(in_FS_OFFSET + -0x228) + 1;
  _va = (Tuple2<pbrt::Point2,_float>)
        (I->
        super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
        ).bits;
  DenselySampledSpectrum::DenselySampledSpectrum(&this->I,(SpectrumHandle *)&va,0x168,0x33e,alloc);
  this->scale = scale;
  iVar19 = (im->resolution).super_Tuple2<pbrt::Point2,_int>.x;
  (this->image).format = im->format;
  (this->image).resolution.super_Tuple2<pbrt::Point2,_int>.x = iVar19;
  (this->image).resolution.super_Tuple2<pbrt::Point2,_int>.y =
       (im->resolution).super_Tuple2<pbrt::Point2,_int>.y;
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::InlinedVector(&(this->image).channelNames,&im->channelNames);
  (this->image).encoding.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = 0;
  pmVar2 = (im->p8).alloc.memoryResource;
  (this->image).encoding.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (im->encoding).
         super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
         .bits;
  (this->image).p8.alloc.memoryResource = pmVar2;
  local_e8 = (_Any_data)(ZEXT816(0) << 0x20);
  (this->image).p8.nStored = 0;
  *(_Any_data *)&(this->image).p8.ptr = local_e8;
  sVar3 = (im->p8).nStored;
  (this->image).p8.nAlloc = (im->p8).nAlloc;
  (this->image).p8.nStored = sVar3;
  (this->image).p8.ptr = (im->p8).ptr;
  (im->p8).nStored = 0;
  *(_Any_data *)&(im->p8).ptr = local_e8;
  (this->image).p16.alloc.memoryResource = (im->p16).alloc.memoryResource;
  (this->image).p16.nStored = 0;
  *(_Any_data *)&(this->image).p16.ptr = local_e8;
  sVar3 = (im->p16).nStored;
  (this->image).p16.nAlloc = (im->p16).nAlloc;
  (this->image).p16.nStored = sVar3;
  (this->image).p16.ptr = (im->p16).ptr;
  (im->p16).nStored = 0;
  *(_Any_data *)&(im->p16).ptr = local_e8;
  (this->image).p32.alloc.memoryResource = (im->p32).alloc.memoryResource;
  (this->image).p32.nStored = 0;
  *(_Any_data *)&(this->image).p32.ptr = local_e8;
  sVar3 = (im->p32).nStored;
  (this->image).p32.nAlloc = (im->p32).nAlloc;
  (this->image).p32.nStored = sVar3;
  (this->image).p32.ptr = (im->p32).ptr;
  (im->p32).nStored = 0;
  *(_Any_data *)&(im->p32).ptr = local_e8;
  this->imageColorSpace = imageColorSpace;
  *(undefined8 *)(this->wrapMode).wrap.values = 0x200000000;
  (this->distrib).domain.pMin.super_Tuple2<pbrt::Point2,_float> =
       (Tuple2<pbrt::Point2,_float>)0x7f7fffff7f7fffff;
  (this->distrib).domain.pMax.super_Tuple2<pbrt::Point2,_float> =
       (Tuple2<pbrt::Point2,_float>)0xff7fffffff7fffff;
  (this->distrib).pConditionalY.alloc.memoryResource = alloc.memoryResource;
  *(_Any_data *)&(this->distrib).pConditionalY.ptr = local_e8;
  (this->distrib).pConditionalY.nStored = 0;
  (this->distrib).pMarginal.func.alloc.memoryResource = alloc.memoryResource;
  *(_Any_data *)&(this->distrib).pMarginal.func.ptr = local_e8;
  (this->distrib).pMarginal.func.nStored = 0;
  (this->distrib).pMarginal.cdf.alloc.memoryResource = alloc.memoryResource;
  *(_Any_data *)&(this->distrib).pMarginal.cdf.ptr = local_e8;
  (this->distrib).pMarginal.cdf.nStored = 0;
  (this->distrib).pMarginal.funcInt = 0.0;
  va = 1;
  d.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x = (int)(this->image).channelNames.nStored;
  if (d.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x == 1) {
    domain = (Bounds2f)vmovhps_avx((undefined1  [16])local_e8,0x40490fdb40c90fdb);
    local_d0 = std::
               _Function_handler<float_(pbrt::Point2<float>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/lights.cpp:444:17)>
               ::_M_invoke;
    local_d8 = std::
               _Function_handler<float_(pbrt::Point2<float>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/lights.cpp:444:17)>
               ::_M_manager;
    AVar21.memoryResource = pstd::pmr::new_delete_resource();
    Image::GetSamplingDistribution
              (&d,&this->image,(function<float_(pbrt::Point2<float>)> *)&local_e8,&domain,AVar21);
    if (local_d8 != (code *)0x0) {
      (*local_d8)(&local_e8,&local_e8,__destroy_functor);
    }
    PVar20.super_Tuple2<pbrt::Point2,_float> = domain.pMin.super_Tuple2<pbrt::Point2,_float>;
    local_48 = domain.pMax.super_Tuple2<pbrt::Point2,_float>;
    uStack_40 = 0;
    AVar21.memoryResource = pstd::pmr::new_delete_resource();
    auVar23._4_4_ = d.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y;
    auVar23._0_4_ = d.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x;
    auVar22._8_8_ = 0;
    auVar22._0_4_ = d.extent.pMax.super_Tuple2<pbrt::Point2,_int>.x;
    auVar22._4_4_ = d.extent.pMax.super_Tuple2<pbrt::Point2,_int>.y;
    auVar23._8_8_ = 0;
    auVar22 = vpsubd_avx(auVar22,auVar23);
    func.n = (size_t)(auVar22._4_4_ * auVar22._0_4_);
    func.ptr = d.values;
    domain_00.pMax.super_Tuple2<pbrt::Point2,_float> = local_48;
    domain_00.pMin.super_Tuple2<pbrt::Point2,_float> = PVar20.super_Tuple2<pbrt::Point2,_float>;
    PiecewiseConstant2D::PiecewiseConstant2D
              ((PiecewiseConstant2D *)&va,func,auVar22._0_4_,auVar22._4_4_,domain_00,AVar21);
    (this->distrib).domain.pMin.super_Tuple2<pbrt::Point2,_float> = _va;
    (this->distrib).domain.pMax.super_Tuple2<pbrt::Point2,_float> = TStack_c0;
    pstd::
    vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>
    ::operator=(&(this->distrib).pConditionalY,&local_b8);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
              (&(this->distrib).pMarginal.func,&local_98);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
              (&(this->distrib).pMarginal.cdf,&local_78);
    (this->distrib).pMarginal.funcInt = local_50;
    (this->distrib).pMarginal.min = local_58;
    (this->distrib).pMarginal.max = FStack_54;
    local_78.nStored = 0;
    (*(local_78.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_78.alloc.memoryResource,local_78.ptr,local_78.nAlloc << 2,4);
    local_98.nStored = 0;
    (*(local_98.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_98.alloc.memoryResource,local_98.ptr,local_98.nAlloc << 2,4);
    pstd::
    vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>
    ::~vector(&local_b8);
    pPVar1 = (this->distrib).pConditionalY.ptr;
    *(size_t *)(in_FS_OFFSET + -0x220) =
         (this->image).p16.nStored * 2 + (this->image).p8.nStored + *(long *)(in_FS_OFFSET + -0x220)
         + (((pPVar1->cdf).nAlloc + (pPVar1->func).nAlloc) * 4 + 0x50) *
           (this->distrib).pConditionalY.nStored +
         ((this->distrib).pMarginal.func.nAlloc + (this->image).p32.nStored +
         (this->distrib).pMarginal.cdf.nAlloc) * 4;
    Array2D<float>::~Array2D(&d);
    return;
  }
  LogFatal<char_const(&)[2],char_const(&)[18],char_const(&)[2],int&,char_const(&)[18],int&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/lights.cpp"
             ,0x1b9,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [2])0x2d6eb40,
             (char (*) [18])"image.NChannels()",(char (*) [2])0x2d6eb40,&va,
             (char (*) [18])"image.NChannels()",(int *)&d);
}

Assistant:

GoniometricLight::GoniometricLight(const Transform &renderFromLight,
                                   const MediumInterface &mediumInterface,
                                   SpectrumHandle I, Float scale, Image im,
                                   const RGBColorSpace *imageColorSpace, Allocator alloc)
    : LightBase(LightType::DeltaPosition, renderFromLight, mediumInterface),
      I(I, alloc),
      scale(scale),
      image(std::move(im)),
      imageColorSpace(imageColorSpace),
      wrapMode(WrapMode::Repeat, WrapMode::Clamp),
      distrib(alloc) {
    CHECK_EQ(1, image.NChannels());
    // Compute sampling distribution for _GoniometricLight_
    Bounds2f domain(Point2f(0, 0), Point2f(2 * Pi, Pi));
    auto dpdA = [](const Point2f &p) { return std::sin(p.y); };
    Array2D<Float> d = image.GetSamplingDistribution(dpdA, domain);
    distrib = PiecewiseConstant2D(d, domain);

    imageBytes += image.BytesUsed() + distrib.BytesUsed();
}